

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O1

void update_op_reg_list(m68k_info *info,cs_m68k_op *op,int write)

{
  byte bVar1;
  uint uVar2;
  uint16_t uVar3;
  ulong uVar4;
  ulong uVar5;
  int i;
  uint uVar6;
  m68k_reg mVar7;
  int i_1;
  
  switch(op->type) {
  case M68K_OP_REG:
switchD_002696d9_caseD_1:
    mVar7 = (op->field_0).reg;
LAB_00269805:
    add_reg_to_rw_list(info,mVar7,write);
    return;
  case M68K_OP_MEM:
    switch(op->address_mode) {
    case M68K_AM_REG_DIRECT_DATA:
    case M68K_AM_REG_DIRECT_ADDR:
      goto switchD_002696d9_caseD_1;
    case M68K_AM_REGI_ADDR:
    case M68K_AM_REGI_ADDR_DISP:
      mVar7 = (op->field_0).reg;
      if (mVar7 == M68K_REG_INVALID) {
        return;
      }
      uVar4 = (ulong)info->regs_read_count;
      if (uVar4 != 0) {
        uVar5 = 0;
        do {
          if (info->regs_read[uVar5] == (uint16_t)mVar7) {
            return;
          }
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      break;
    case M68K_AM_REGI_ADDR_POST_INC:
    case M68K_AM_REGI_ADDR_PRE_DEC:
      if ((op->field_0).reg == M68K_REG_INVALID) {
        return;
      }
      bVar1 = info->regs_write_count;
      uVar4 = (ulong)bVar1;
      uVar3 = (uint16_t)(op->field_0).reg;
      if (uVar4 != 0) {
        uVar5 = 0;
        do {
          if (info->regs_write[uVar5] == uVar3) {
            return;
          }
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      info->regs_write[uVar4] = uVar3;
      info->regs_write_count = bVar1 + 1;
      return;
    case M68K_AM_AREGI_INDEX_8_BIT_DISP:
    case M68K_AM_AREGI_INDEX_BASE_DISP:
    case M68K_AM_MEMI_POST_INDEX:
    case M68K_AM_MEMI_PRE_INDEX:
    case M68K_AM_PCI_INDEX_8_BIT_DISP:
    case M68K_AM_PCI_INDEX_BASE_DISP:
    case M68K_AM_PC_MEMI_POST_INDEX:
    case M68K_AM_PC_MEMI_PRE_INDEX:
      mVar7 = (op->mem).index_reg;
      if (mVar7 != M68K_REG_INVALID) {
        bVar1 = info->regs_read_count;
        uVar4 = (ulong)bVar1;
        uVar3 = (uint16_t)mVar7;
        if (uVar4 != 0) {
          uVar5 = 0;
          do {
            if (info->regs_read[uVar5] == uVar3) goto LAB_002697b5;
            uVar5 = uVar5 + 1;
          } while (uVar4 != uVar5);
        }
        info->regs_read[uVar4] = uVar3;
        info->regs_read_count = bVar1 + 1;
      }
LAB_002697b5:
      mVar7 = (op->mem).base_reg;
      if (mVar7 == M68K_REG_INVALID) {
        return;
      }
      uVar4 = (ulong)info->regs_read_count;
      if (uVar4 != 0) {
        uVar5 = 0;
        do {
          if (info->regs_read[uVar5] == (uint16_t)mVar7) {
            return;
          }
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      break;
    default:
      goto switchD_002696d9_caseD_2;
    }
    info->regs_read[uVar4] = (uint16_t)mVar7;
    info->regs_read_count = (char)uVar4 + '\x01';
    break;
  case M68K_OP_REG_BITS:
    uVar2 = op->register_bits;
    uVar6 = 0;
    do {
      if (((uVar2 & 0xff) >> (uVar6 & 0x1f) & 1) != 0) {
        add_reg_to_rw_list(info,uVar6 + M68K_REG_D0,write);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != 8);
    uVar6 = 0;
    do {
      if (((uVar2 >> 8 & 0xff) >> (uVar6 & 0x1f) & 1) != 0) {
        add_reg_to_rw_list(info,uVar6 + M68K_REG_A0,write);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != 8);
    uVar6 = 0;
    do {
      if (((uVar2 >> 0x10 & 0xff) >> (uVar6 & 0x1f) & 1) != 0) {
        add_reg_to_rw_list(info,uVar6 + M68K_REG_FP0,write);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != 8);
    break;
  case M68K_OP_REG_PAIR:
    add_reg_to_rw_list(info,(op->field_0).reg + M68K_REG_D0,write);
    mVar7 = (op->field_0).reg_pair.reg_1 + M68K_REG_D0;
    goto LAB_00269805;
  }
switchD_002696d9_caseD_2:
  return;
}

Assistant:

static void update_op_reg_list(m68k_info *info, cs_m68k_op *op, int write)
{
	switch ((int)op->type) {
		case M68K_OP_REG:
			add_reg_to_rw_list(info, op->reg, write);
			break;

		case M68K_OP_MEM:
			update_am_reg_list(info, op, write);
			break;

		case M68K_OP_REG_BITS:
			update_reg_list_regbits(info, op, write);
			break;

		case M68K_OP_REG_PAIR:
			add_reg_to_rw_list(info, M68K_REG_D0 + op->reg_pair.reg_0, write);
			add_reg_to_rw_list(info, M68K_REG_D0 + op->reg_pair.reg_1, write);
			break;
	}
}